

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

void compactor_switch_file(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  char cVar1;
  char *dbfile;
  avl_node *node;
  err_log_callback *log_callback_00;
  compactor_meta meta;
  openfiles_elem_conflict query;
  char metafile [1024];
  compactor_meta local_d70;
  char local_968 [1296];
  avl_node local_458 [2];
  char local_428 [1024];
  
  strcpy(local_968,old_file->filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  node = avl_search(&openfiles,local_458,_compactor_cmp);
  if (node == (avl_node *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  }
  else {
    avl_remove(&openfiles,node);
    strcpy((char *)(node + -0x36),new_file->filename);
    node[-0xc].right = (avl_node *)new_file;
    *(undefined4 *)&node[-1].left = 1;
    *(undefined2 *)((long)&node[-1].left + 4) = 0;
    gettimeofday((timeval *)(node + 1),(__timezone_ptr_t)0x0);
    avl_insert(&openfiles,node,_compactor_cmp);
    cVar1 = *(char *)((long)&node[-10].right + 6);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    if (cVar1 == '\x01') {
      dbfile = new_file->filename;
      _compactor_convert_dbfile_to_metafile(dbfile,local_428);
      _strcpy_fname(local_d70.filename,dbfile);
      _compactor_store_metafile(local_428,&local_d70,log_callback_00);
    }
  }
  return;
}

Assistant:

void compactor_switch_file(struct filemgr *old_file, struct filemgr *new_file,
                           err_log_callback *log_callback)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    struct compactor_meta meta;

    strcpy(query.filename, old_file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        char metafile[MAX_FNAMELEN];
        fdb_compaction_mode_t comp_mode;

        elem = _get_entry(a, struct openfiles_elem, avl);
        avl_remove(&openfiles, a);
        strcpy(elem->filename, new_file->filename);
        elem->file = new_file;
        elem->register_count = 1;
        elem->daemon_compact_in_progress = false;
        // clear compaction flag
        elem->compaction_flag = false;
        // As this function is invoked at the end of compaction, set the compaction
        // timestamp to the current time.
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        comp_mode = elem->config.compaction_mode;
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as we don't
                                 // expect more than one compaction task completion for
                                 // the same file.

        if (comp_mode == FDB_COMPACTION_AUTO) {
            _compactor_convert_dbfile_to_metafile(new_file->filename, metafile);
            _strcpy_fname(meta.filename, new_file->filename);
            _compactor_store_metafile(metafile, &meta, log_callback);
        }
    } else {
        mutex_unlock(&cpt_lock);
    }
}